

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.c
# Opt level: O1

void invalidate_bitmap(tgestate_t *state,uint8_t *start,int width,int height)

{
  zxspectrum_t *pzVar1;
  int iVar2;
  uint uVar3;
  zxbox_t dirty;
  zxbox_t local_10;
  
  pzVar1 = state->speccy;
  iVar2 = (int)start - (int)pzVar1;
  uVar3 = iVar2 - 0x30;
  local_10.y1 = 0xc0 - (uVar3 >> 5 & 0xc0 | uVar3 >> 2 & 0x38 | uVar3 >> 8 & 7);
  local_10.y0 = local_10.y1 - height;
  local_10.x0 = iVar2 * 8 - 0x180U & 0xff;
  local_10.x1 = width + local_10.x0;
  (*pzVar1->draw)(pzVar1,&local_10);
  return;
}

Assistant:

void invalidate_bitmap(tgestate_t *state,
                       uint8_t    *start,
                       int         width,
                       int         height)
{
  uint8_t   *base = &state->speccy->screen.pixels[0];
  ptrdiff_t  offset;
  int        x,y;
  zxbox_t    dirty;

  offset = start - base;

  /* Convert screen offset to cartesian for the interface. */
  x = (offset & 31) * 8;
  y = ((offset & 0x0700) >> 8) |
      ((offset & 0x00E0) >> 2) |
      ((offset & 0x1800) >> 5);
  y = 191 - y;    /* flip */
  y = y + 1;      /* inclusive lower bound becomes exclusive upper */
  y = y - height; /* get min-y */

  dirty.x0 = x;
  dirty.y0 = y;
  dirty.x1 = x + width;
  dirty.y1 = y + height;
  state->speccy->draw(state->speccy, &dirty);
}